

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiDockNode * ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode *node,ImVec2 pos)

{
  float fVar1;
  float fVar2;
  ImGuiDockNode *pIVar3;
  
  if ((node->field_0xb9 & 2) != 0) {
    while (((fVar1 = (node->Pos).x, fVar1 <= pos.x && (fVar2 = (node->Pos).y, fVar2 <= pos.y)) &&
           (pos.x < fVar1 + (node->Size).x))) {
      if (fVar2 + (node->Size).y <= pos.y) {
        return (ImGuiDockNode *)0x0;
      }
      if (node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        return node;
      }
      pIVar3 = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0],pos);
      if (pIVar3 != (ImGuiDockNode *)0x0) {
        return pIVar3;
      }
      node = node->ChildNodes[1];
      if ((node->field_0xb9 & 2) == 0) {
        return (ImGuiDockNode *)0x0;
      }
    }
  }
  return (ImGuiDockNode *)0x0;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode* node, ImVec2 pos)
{
    if (!node->IsVisible)
        return NULL;

    const float dock_spacing = 0.0f;// g.Style.ItemInnerSpacing.x; // FIXME: Relation to DOCKING_SPLITTER_SIZE?
    ImRect r(node->Pos, node->Pos + node->Size);
    r.Expand(dock_spacing * 0.5f);
    bool inside = r.Contains(pos);
    if (!inside)
        return NULL;

    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0], pos))
        return hovered_node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[1], pos))
        return hovered_node;

    return NULL;
}